

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLFWbool GVar1;
  int iVar2;
  _GLFWwindow *window;
  long lVar3;
  _GLFWfbconfig *p_Var4;
  _GLFWfbconfig *p_Var5;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  _GLFWwndconfig wndconfig;
  
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/alifarazz[P]bezier_curve/build_O2/_deps/glfw-src/src/window.c"
                  ,0xa2,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (width < 0) {
    __assert_fail("width >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/alifarazz[P]bezier_curve/build_O2/_deps/glfw-src/src/window.c"
                  ,0xa3,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (height < 0) {
    __assert_fail("height >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/alifarazz[P]bezier_curve/build_O2/_deps/glfw-src/src/window.c"
                  ,0xa4,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfw.initialized != 0) {
    if (width == 0 || height == 0) {
      _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,height);
      return (GLFWwindow *)0x0;
    }
    p_Var4 = &_glfw.hints.framebuffer;
    p_Var5 = &fbconfig;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      iVar2 = p_Var4->greenBits;
      p_Var5->redBits = p_Var4->redBits;
      p_Var5->greenBits = iVar2;
      p_Var4 = (_GLFWfbconfig *)&p_Var4->blueBits;
      p_Var5 = (_GLFWfbconfig *)&p_Var5->blueBits;
    }
    ctxconfig._48_8_ = _glfw.hints.context._48_8_;
    ctxconfig._32_8_ = _glfw.hints.context._32_8_;
    ctxconfig.share = _glfw.hints.context.share;
    ctxconfig._16_8_ = _glfw.hints.context._16_8_;
    ctxconfig._24_8_ = _glfw.hints.context._24_8_;
    ctxconfig._0_8_ = _glfw.hints.context._0_8_;
    ctxconfig._8_8_ = _glfw.hints.context._8_8_;
    memcpy(&wndconfig,&_glfw.hints.window,0x340);
    ctxconfig.share = (_GLFWwindow *)share;
    wndconfig.width = width;
    wndconfig.height = height;
    wndconfig.title = title;
    GVar1 = _glfwIsValidContextConfig(&ctxconfig);
    if (GVar1 != 0) {
      window = (_GLFWwindow *)calloc(1,0xb98);
      window->next = _glfw.windowListHead;
      _glfw.windowListHead = window;
      (window->videoMode).width = width;
      (window->videoMode).height = height;
      (window->videoMode).redBits = fbconfig.redBits;
      (window->videoMode).greenBits = fbconfig.greenBits;
      (window->videoMode).blueBits = fbconfig.blueBits;
      (window->videoMode).refreshRate = _glfw.hints.refreshRate;
      window->monitor = (_GLFWmonitor *)monitor;
      window->resizable = wndconfig.resizable;
      window->decorated = wndconfig.decorated;
      window->autoIconify = wndconfig.autoIconify;
      window->floating = wndconfig.floating;
      window->focusOnShow = wndconfig.focusOnShow;
      window->cursorMode = 0x34001;
      window->doublebuffer = fbconfig.doublebuffer;
      window->minwidth = -1;
      window->minheight = -1;
      window->maxwidth = -1;
      window->maxheight = -1;
      window->numer = -1;
      window->denom = -1;
      iVar2 = _glfwPlatformCreateWindow(window,&wndconfig,&ctxconfig,&fbconfig);
      if ((iVar2 != 0) &&
         ((ctxconfig.client == 0 ||
          (GVar1 = _glfwRefreshContextAttribs(window,&ctxconfig), GVar1 != 0)))) {
        if (window->monitor != (_GLFWmonitor *)0x0) {
          if (wndconfig.centerCursor == 0) {
            return (GLFWwindow *)window;
          }
          _glfwCenterCursorInContentArea(window);
          return (GLFWwindow *)window;
        }
        if (wndconfig.visible == 0) {
          return (GLFWwindow *)window;
        }
        _glfwPlatformShowWindow(window);
        if (wndconfig.focused == 0) {
          return (GLFWwindow *)window;
        }
        _glfwPlatformFocusWindow(window);
        return (GLFWwindow *)window;
      }
      glfwDestroyWindow((GLFWwindow *)window);
    }
    return (GLFWwindow *)0x0;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;

    assert(title != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = (_GLFWmonitor*) monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->focusOnShow = wndconfig.focusOnShow;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    window->doublebuffer = fbconfig.doublebuffer;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        if (!_glfwRefreshContextAttribs(window, &ctxconfig))
        {
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }
    }

    if (window->monitor)
    {
        if (wndconfig.centerCursor)
            _glfwCenterCursorInContentArea(window);
    }
    else
    {
        if (wndconfig.visible)
        {
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused)
                _glfwPlatformFocusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}